

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O3

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::read_sequence_infos(HL1MDLLoader *this)

{
  pointer *pppaVar1;
  char *pcVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  Header_HL1 *pHVar6;
  iterator __position;
  pointer pbVar7;
  uint __val;
  ulong uVar8;
  undefined8 uVar9;
  size_type sVar10;
  uint uVar11;
  bool bVar12;
  uint uVar13;
  aiNode *paVar14;
  aiNode **ppaVar15;
  aiMetadata *paVar16;
  aiString *paVar17;
  aiMetadataEntry *paVar18;
  int *piVar19;
  undefined4 *puVar20;
  uint *puVar21;
  undefined8 *puVar22;
  HL1ImportSettings *pHVar23;
  long *plVar24;
  Logger *pLVar25;
  int32_t *piVar26;
  size_type *psVar27;
  long *plVar28;
  uint __len;
  size_t sVar29;
  ulong *puVar30;
  char *pcVar31;
  long lVar32;
  ulong uVar33;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  aiNode *blend_controllers_node;
  int num_blend_controllers;
  vector<aiNode_*,_std::allocator<aiNode_*>_> sequence_info_node_children;
  aiNode *sequence_infos_node;
  aiNode *pEventsNode;
  string __str;
  char *local_628;
  aiNode *local_618;
  ulong local_610;
  undefined1 local_608 [24];
  int local_5f0;
  allocator<char> local_5e9;
  ulong *local_5e8;
  ulong local_5e0;
  ulong local_5d8;
  long lStack_5d0;
  aiNode **local_5c8;
  iterator iStack_5c0;
  aiNode **local_5b8;
  aiNode *local_5a8;
  aiNode *local_5a0;
  aiNode *local_598;
  long local_590;
  undefined1 local_588 [24];
  char acStack_570 [16];
  ulong *local_560;
  long local_558;
  ulong local_550 [2];
  ulong *local_540;
  long local_538;
  ulong local_530 [2];
  ulong *local_520;
  long local_518;
  ulong local_510;
  long lStack_508;
  long *local_500;
  char local_4f8 [8];
  long local_4f0;
  char acStack_4e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  long *local_4c0 [2];
  long local_4b0 [2];
  long *local_4a0;
  long local_498;
  long local_490;
  long lStack_488;
  long local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  long *local_458 [2];
  long local_448 [2];
  string local_438 [32];
  
  pHVar6 = this->header_;
  if (pHVar6->numseq != 0) {
    iVar4 = pHVar6->seqindex;
    local_608._16_8_ = this;
    paVar14 = (aiNode *)operator_new(0x478);
    local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"<MDL_sequence_infos>","");
    aiNode::aiNode(paVar14,local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
      operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
    }
    uVar9 = local_608._16_8_;
    __position._M_current =
         (((vector<aiNode_*,_std::allocator<aiNode_*>_> *)(local_608._16_8_ + 0x58))->
         super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    local_5a0 = paVar14;
    if (__position._M_current ==
        (((vector<aiNode_*,_std::allocator<aiNode_*>_> *)(local_608._16_8_ + 0x58))->
        super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                ((vector<aiNode*,std::allocator<aiNode*>> *)(local_608._16_8_ + 0x58),__position,
                 &local_5a0);
    }
    else {
      *__position._M_current = paVar14;
      pppaVar1 = &(((vector<aiNode_*,_std::allocator<aiNode_*>_> *)(local_608._16_8_ + 0x58))->
                  super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppaVar1 = *pppaVar1 + 1;
    }
    paVar14 = local_5a0;
    uVar5 = (*(Header_HL1 **)(uVar9 + 0x28))->numseq;
    local_5a0->mNumChildren = uVar5;
    ppaVar15 = (aiNode **)operator_new__((ulong)uVar5 << 3);
    paVar14->mChildren = ppaVar15;
    local_5c8 = (aiNode **)0x0;
    iStack_5c0._M_current = (aiNode **)0x0;
    local_5b8 = (aiNode **)0x0;
    if (0 < (*(Header_HL1 **)(uVar9 + 0x28))->numseq) {
      local_628 = (pHVar6->super_HalfLifeMDLBaseHeader).ident + iVar4;
      lVar32 = 0;
      local_5f0 = 0;
      do {
        if (iStack_5c0._M_current != local_5c8) {
          iStack_5c0._M_current = local_5c8;
        }
        paVar14 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar14,(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(local_608._16_8_ + 0xb0))->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar32);
        local_5a0->mChildren[lVar32] = paVar14;
        paVar14->mParent = local_5a0;
        local_5a8 = paVar14;
        local_480 = lVar32;
        paVar16 = (aiMetadata *)operator_new(0x18);
        paVar16->mNumProperties = 0x10;
        paVar17 = (aiString *)operator_new__(0x4040);
        lVar32 = 5;
        do {
          pcVar31 = paVar17->data + lVar32 + -9;
          pcVar31[0] = '\0';
          pcVar31[1] = '\0';
          pcVar31[2] = '\0';
          pcVar31[3] = '\0';
          paVar17->data[lVar32 + -5] = '\0';
          memset(paVar17->data + lVar32 + -4,0x1b,0x3ff);
          lVar32 = lVar32 + 0x404;
        } while (lVar32 != 0x4045);
        paVar16->mKeys = paVar17;
        paVar18 = (aiMetadataEntry *)operator_new__(0x100);
        memset(paVar18,0,0x100);
        paVar16->mValues = paVar18;
        local_5a8->mMetaData = paVar16;
        local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"AnimationIndex","");
        sVar10 = local_438[0]._M_string_length;
        if ((paVar16->mNumProperties != 0) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17->length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17->data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17->data[sVar10] = '\0';
          }
          paVar16->mValues->mType = AI_INT32;
          piVar19 = (int *)operator_new(4);
          *piVar19 = local_5f0;
          paVar16->mValues->mData = piVar19;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_5f0 = local_5f0 + *(int *)(local_628 + 0x78);
        local_618 = (aiNode *)local_608;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"SequenceGroup","");
        pbVar7 = (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_608._16_8_ + 200))->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar33 = pbVar7[*(int *)(local_628 + 0x9c)]._M_string_length;
        sVar29 = uVar33 & 0xffffffff;
        if ((uVar33 & 0xfffffc00) != 0) {
          sVar29 = 0x3ff;
        }
        local_438[0]._M_dataplus._M_p._0_4_ = (uint)sVar29;
        memcpy((void *)((long)&local_438[0]._M_dataplus._M_p + 4),
               pbVar7[*(int *)(local_628 + 0x9c)]._M_dataplus._M_p,sVar29);
        uVar33 = local_610;
        *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + sVar29 + 4) = 0;
        if ((1 < paVar16->mNumProperties) && (local_610 != 0)) {
          if (local_610 < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[1].length = (ai_uint32)local_610;
            memcpy(paVar17[1].data,local_618,local_610);
            paVar17[1].data[uVar33] = '\0';
          }
          paVar16->mValues[1].mType = AI_AISTRING;
          puVar20 = (undefined4 *)operator_new(0x404);
          if (0x3fe < (uint)sVar29) {
            sVar29 = 0x3ff;
          }
          *puVar20 = (int)sVar29;
          memcpy(puVar20 + 1,(void *)((long)&local_438[0]._M_dataplus._M_p + 4),sVar29);
          *(undefined1 *)((long)puVar20 + sVar29 + 4) = 0;
          paVar16->mValues[1].mData = puVar20;
        }
        if (local_618 != (aiNode *)local_608) {
          operator_delete(local_618,local_608._0_8_ + 1);
        }
        paVar34 = &local_438[0].field_2;
        local_438[0]._M_dataplus._M_p = (pointer)paVar34;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"FramesPerSecond","");
        sVar10 = local_438[0]._M_string_length;
        if ((2 < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[2].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17[2].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17[2].data[sVar10] = '\0';
          }
          paVar16->mValues[2].mType = AI_FLOAT;
          puVar20 = (undefined4 *)operator_new(4);
          *puVar20 = *(undefined4 *)(local_628 + 0x20);
          paVar16->mValues[2].mData = puVar20;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar34) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar34;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"NumFrames","");
        sVar10 = local_438[0]._M_string_length;
        if ((3 < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[3].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17[3].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17[3].data[sVar10] = '\0';
          }
          paVar16->mValues[3].mType = AI_INT32;
          puVar20 = (undefined4 *)operator_new(4);
          *puVar20 = *(undefined4 *)(local_628 + 0x38);
          paVar16->mValues[3].mData = puVar20;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar34) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar34;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"NumBlends","");
        sVar10 = local_438[0]._M_string_length;
        if ((4 < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[4].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17[4].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17[4].data[sVar10] = '\0';
          }
          paVar16->mValues[4].mType = AI_INT32;
          puVar20 = (undefined4 *)operator_new(4);
          *puVar20 = *(undefined4 *)(local_628 + 0x78);
          paVar16->mValues[4].mData = puVar20;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar34) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar34;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Activity","");
        sVar10 = local_438[0]._M_string_length;
        if ((5 < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[5].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17[5].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17[5].data[sVar10] = '\0';
          }
          paVar16->mValues[5].mType = AI_INT32;
          puVar20 = (undefined4 *)operator_new(4);
          *puVar20 = *(undefined4 *)(local_628 + 0x28);
          paVar16->mValues[5].mData = puVar20;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar34) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar34;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"ActivityWeight","");
        sVar10 = local_438[0]._M_string_length;
        if ((6 < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[6].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17[6].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17[6].data[sVar10] = '\0';
          }
          paVar16->mValues[6].mType = AI_INT32;
          puVar20 = (undefined4 *)operator_new(4);
          *puVar20 = *(undefined4 *)(local_628 + 0x2c);
          paVar16->mValues[6].mData = puVar20;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar34) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar34;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"MotionFlags","");
        sVar10 = local_438[0]._M_string_length;
        if ((7 < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[7].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17[7].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17[7].data[sVar10] = '\0';
          }
          paVar16->mValues[7].mType = AI_INT32;
          puVar20 = (undefined4 *)operator_new(4);
          *puVar20 = *(undefined4 *)(local_628 + 0x44);
          paVar16->mValues[7].mData = puVar20;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar34) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar34;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"MotionBone","");
        sVar10 = local_438[0]._M_string_length;
        if ((8 < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          paVar14 = (((vector<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone,_std::allocator<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone>_>
                       *)(local_608._16_8_ + 0xe0))->
                    super__Vector_base<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone,_std::allocator<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone>_>
                    )._M_impl.super__Vector_impl_data._M_start[*(int *)(local_628 + 0x48)].node;
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[8].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17[8].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17[8].data[sVar10] = '\0';
          }
          paVar16->mValues[8].mType = AI_AISTRING;
          puVar21 = (uint *)operator_new(0x404);
          uVar5 = (paVar14->mName).length;
          if (0x3fe < uVar5) {
            uVar5 = 0x3ff;
          }
          *puVar21 = uVar5;
          memcpy(puVar21 + 1,(paVar14->mName).data,(ulong)uVar5);
          *(undefined1 *)((long)puVar21 + (ulong)uVar5 + 4) = 0;
          paVar16->mValues[8].mData = puVar21;
        }
        paVar34 = &local_438[0].field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar34) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar34;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"LinearMovement","");
        sVar10 = local_438[0]._M_string_length;
        if ((9 < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          local_588._16_8_ = *(undefined8 *)(local_628 + 0x4c);
          acStack_570[0] = '\0';
          acStack_570[1] = '\0';
          acStack_570[2] = '\0';
          acStack_570[3] = '\0';
          acStack_570[4] = '\0';
          acStack_570[5] = '\0';
          acStack_570[6] = '\0';
          acStack_570[7] = '\0';
          uVar3 = *(undefined4 *)(local_628 + 0x54);
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[9].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17[9].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17[9].data[sVar10] = '\0';
          }
          paVar16->mValues[9].mType = AI_AIVECTOR3D;
          puVar22 = (undefined8 *)operator_new(0xc);
          *puVar22 = local_588._16_8_;
          *(undefined4 *)(puVar22 + 1) = uVar3;
          paVar16->mValues[9].mData = puVar22;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar34) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar34;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"BBMin","");
        sVar10 = local_438[0]._M_string_length;
        if ((10 < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          local_588._16_8_ = *(undefined8 *)(local_628 + 0x60);
          acStack_570[0] = '\0';
          acStack_570[1] = '\0';
          acStack_570[2] = '\0';
          acStack_570[3] = '\0';
          acStack_570[4] = '\0';
          acStack_570[5] = '\0';
          acStack_570[6] = '\0';
          acStack_570[7] = '\0';
          uVar3 = *(undefined4 *)(local_628 + 0x68);
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[10].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17[10].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17[10].data[sVar10] = '\0';
          }
          paVar16->mValues[10].mType = AI_AIVECTOR3D;
          puVar22 = (undefined8 *)operator_new(0xc);
          *puVar22 = local_588._16_8_;
          *(undefined4 *)(puVar22 + 1) = uVar3;
          paVar16->mValues[10].mData = puVar22;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar34) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar34;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"BBMax","");
        sVar10 = local_438[0]._M_string_length;
        if ((0xb < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          local_588._16_8_ = *(undefined8 *)(local_628 + 0x6c);
          acStack_570[0] = '\0';
          acStack_570[1] = '\0';
          acStack_570[2] = '\0';
          acStack_570[3] = '\0';
          acStack_570[4] = '\0';
          acStack_570[5] = '\0';
          acStack_570[6] = '\0';
          acStack_570[7] = '\0';
          uVar3 = *(undefined4 *)(local_628 + 0x74);
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[0xb].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17[0xb].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17[0xb].data[sVar10] = '\0';
          }
          paVar16->mValues[0xb].mType = AI_AIVECTOR3D;
          puVar22 = (undefined8 *)operator_new(0xc);
          *puVar22 = local_588._16_8_;
          *(undefined4 *)(puVar22 + 1) = uVar3;
          paVar16->mValues[0xb].mData = puVar22;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar34) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar34;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"EntryNode","");
        sVar10 = local_438[0]._M_string_length;
        if ((0xc < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[0xc].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17[0xc].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17[0xc].data[sVar10] = '\0';
          }
          paVar16->mValues[0xc].mType = AI_INT32;
          puVar20 = (undefined4 *)operator_new(4);
          *puVar20 = *(undefined4 *)(local_628 + 0xa0);
          paVar16->mValues[0xc].mData = puVar20;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar34) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar34;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"ExitNode","");
        sVar10 = local_438[0]._M_string_length;
        if ((0xd < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[0xd].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17[0xd].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17[0xd].data[sVar10] = '\0';
          }
          paVar16->mValues[0xd].mType = AI_INT32;
          puVar20 = (undefined4 *)operator_new(4);
          *puVar20 = *(undefined4 *)(local_628 + 0xa4);
          paVar16->mValues[0xd].mData = puVar20;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar34) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar34;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"NodeFlags","");
        sVar10 = local_438[0]._M_string_length;
        if ((0xe < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[0xe].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17[0xe].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17[0xe].data[sVar10] = '\0';
          }
          paVar16->mValues[0xe].mType = AI_INT32;
          puVar20 = (undefined4 *)operator_new(4);
          *puVar20 = *(undefined4 *)(local_628 + 0xa8);
          paVar16->mValues[0xe].mData = puVar20;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar34) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        local_438[0]._M_dataplus._M_p = (pointer)paVar34;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Flags","");
        sVar10 = local_438[0]._M_string_length;
        if ((0xf < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
          if (local_438[0]._M_string_length < 0x400) {
            paVar17 = paVar16->mKeys;
            paVar17[0xf].length = (ai_uint32)local_438[0]._M_string_length;
            memcpy(paVar17[0xf].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
            paVar17[0xf].data[sVar10] = '\0';
          }
          paVar16->mValues[0xf].mType = AI_INT32;
          puVar20 = (undefined4 *)operator_new(4);
          *puVar20 = *(undefined4 *)(local_628 + 0x24);
          paVar16->mValues[0xf].mData = puVar20;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != paVar34) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        pHVar23 = *(HL1ImportSettings **)(local_608._16_8_ + 0x20);
        if (pHVar23->read_blend_controllers == true) {
          bVar12 = get_num_blend_controllers(*(int *)(local_628 + 0x78),(int *)&local_5e8);
          puVar30 = local_5e8;
          uVar5 = (uint)local_5e8;
          if (bVar12 && (uint)local_5e8 != 0) {
            paVar14 = (aiNode *)operator_new(0x478);
            local_438[0]._M_dataplus._M_p = (pointer)paVar34;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_438,"BlendControllers","");
            aiNode::aiNode(paVar14,local_438);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438[0]._M_dataplus._M_p != paVar34) {
              operator_delete(local_438[0]._M_dataplus._M_p,
                              local_438[0].field_2._M_allocated_capacity + 1);
            }
            local_618 = paVar14;
            if (iStack_5c0._M_current == local_5b8) {
              std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                        ((vector<aiNode*,std::allocator<aiNode*>> *)&local_5c8,iStack_5c0,&local_618
                        );
            }
            else {
              *iStack_5c0._M_current = paVar14;
              iStack_5c0._M_current = iStack_5c0._M_current + 1;
            }
            paVar14 = local_618;
            local_618->mParent = local_5a8;
            local_618->mNumChildren = uVar5;
            ppaVar15 = (aiNode **)operator_new__(((ulong)puVar30 & 0xffffffff) << 3);
            paVar14->mChildren = ppaVar15;
            if (paVar14->mNumChildren != 0) {
              uVar33 = 0;
              do {
                paVar14 = (aiNode *)operator_new(0x478);
                aiNode::aiNode(paVar14);
                local_618->mChildren[uVar33] = paVar14;
                paVar14->mParent = local_618;
                paVar16 = (aiMetadata *)operator_new(0x18);
                paVar16->mNumProperties = 3;
                paVar17 = (aiString *)operator_new__(0xc0c);
                lVar32 = 5;
                do {
                  pcVar31 = paVar17->data + lVar32 + -9;
                  pcVar31[0] = '\0';
                  pcVar31[1] = '\0';
                  pcVar31[2] = '\0';
                  pcVar31[3] = '\0';
                  paVar17->data[lVar32 + -5] = '\0';
                  memset(paVar17->data + lVar32 + -4,0x1b,0x3ff);
                  lVar32 = lVar32 + 0x404;
                } while (lVar32 != 0xc11);
                paVar16->mKeys = paVar17;
                paVar18 = (aiMetadataEntry *)operator_new__(0x30);
                *(undefined8 *)(paVar18 + 2) = 0;
                paVar18[2].mData = (void *)0x0;
                *(undefined8 *)(paVar18 + 1) = 0;
                paVar18[1].mData = (void *)0x0;
                *(undefined8 *)paVar18 = 0;
                paVar18->mData = (void *)0x0;
                paVar16->mValues = paVar18;
                paVar14->mMetaData = paVar16;
                local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Start","");
                sVar10 = local_438[0]._M_string_length;
                if ((paVar16->mNumProperties != 0) && (local_438[0]._M_string_length != 0)) {
                  if (local_438[0]._M_string_length < 0x400) {
                    paVar17 = paVar16->mKeys;
                    paVar17->length = (ai_uint32)local_438[0]._M_string_length;
                    memcpy(paVar17->data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length
                          );
                    paVar17->data[sVar10] = '\0';
                  }
                  paVar16->mValues->mType = AI_FLOAT;
                  puVar20 = (undefined4 *)operator_new(4);
                  *puVar20 = *(undefined4 *)(local_628 + uVar33 * 4 + 0x88);
                  paVar16->mValues->mData = puVar20;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
                  operator_delete(local_438[0]._M_dataplus._M_p,
                                  local_438[0].field_2._M_allocated_capacity + 1);
                }
                local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"End","");
                sVar10 = local_438[0]._M_string_length;
                if ((1 < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
                  if (local_438[0]._M_string_length < 0x400) {
                    paVar17 = paVar16->mKeys;
                    paVar17[1].length = (ai_uint32)local_438[0]._M_string_length;
                    memcpy(paVar17[1].data,local_438[0]._M_dataplus._M_p,
                           local_438[0]._M_string_length);
                    paVar17[1].data[sVar10] = '\0';
                  }
                  paVar16->mValues[1].mType = AI_FLOAT;
                  puVar20 = (undefined4 *)operator_new(4);
                  *puVar20 = *(undefined4 *)(local_628 + uVar33 * 4 + 0x90);
                  paVar16->mValues[1].mData = puVar20;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
                  operator_delete(local_438[0]._M_dataplus._M_p,
                                  local_438[0].field_2._M_allocated_capacity + 1);
                }
                local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_438,"MotionFlags","");
                sVar10 = local_438[0]._M_string_length;
                if ((2 < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
                  if (local_438[0]._M_string_length < 0x400) {
                    paVar17 = paVar16->mKeys;
                    paVar17[2].length = (ai_uint32)local_438[0]._M_string_length;
                    memcpy(paVar17[2].data,local_438[0]._M_dataplus._M_p,
                           local_438[0]._M_string_length);
                    paVar17[2].data[sVar10] = '\0';
                  }
                  paVar16->mValues[2].mType = AI_INT32;
                  puVar20 = (undefined4 *)operator_new(4);
                  *puVar20 = *(undefined4 *)(local_628 + uVar33 * 4 + 0x80);
                  paVar16->mValues[2].mData = puVar20;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
                  operator_delete(local_438[0]._M_dataplus._M_p,
                                  local_438[0].field_2._M_allocated_capacity + 1);
                }
                uVar33 = uVar33 + 1;
              } while (uVar33 < local_618->mNumChildren);
            }
          }
          pHVar23 = *(HL1ImportSettings **)(local_608._16_8_ + 0x20);
        }
        paVar34 = &local_438[0].field_2;
        if ((pHVar23->read_animation_events == true) && (*(int *)(local_628 + 0x30) != 0)) {
          if (0x400 < *(int *)(local_628 + 0x30)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_458,local_628,&local_5e9);
            plVar24 = (long *)std::__cxx11::string::replace((ulong)local_458,0,(char *)0x0,0x6c9ca3)
            ;
            psVar27 = (size_type *)(plVar24 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar24 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_4e0.field_2._M_allocated_capacity = *psVar27;
              local_4e0.field_2._8_4_ = *(undefined4 *)(plVar24 + 3);
              local_4e0.field_2._12_4_ = *(undefined4 *)((long)plVar24 + 0x1c);
              local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
            }
            else {
              local_4e0.field_2._M_allocated_capacity = *psVar27;
              local_4e0._M_dataplus._M_p = (pointer)*plVar24;
            }
            local_4e0._M_string_length = plVar24[1];
            *plVar24 = (long)psVar27;
            plVar24[1] = 0;
            *(undefined1 *)(plVar24 + 2) = 0;
            uVar5 = *(uint *)(local_628 + 0x30);
            local_4c0[0] = local_4b0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4c0,"animation events","");
            pLVar25 = DefaultLogger::get();
            std::operator+(&local_478,"[Half-Life 1 MDL] ",&local_4e0);
            plVar24 = (long *)std::__cxx11::string::append((char *)&local_478);
            local_520 = &local_510;
            puVar30 = (ulong *)(plVar24 + 2);
            if ((ulong *)*plVar24 == puVar30) {
              local_510 = *puVar30;
              lStack_508 = plVar24[3];
            }
            else {
              local_510 = *puVar30;
              local_520 = (ulong *)*plVar24;
            }
            local_518 = plVar24[1];
            *plVar24 = (long)puVar30;
            plVar24[1] = 0;
            *(undefined1 *)(plVar24 + 2) = 0;
            __val = -uVar5;
            if (0 < (int)uVar5) {
              __val = uVar5;
            }
            __len = 1;
            if (9 < __val) {
              uVar33 = (ulong)__val;
              uVar11 = 4;
              do {
                __len = uVar11;
                uVar13 = (uint)uVar33;
                if (uVar13 < 100) {
                  __len = __len - 2;
                  goto LAB_0047fb81;
                }
                if (uVar13 < 1000) {
                  __len = __len - 1;
                  goto LAB_0047fb81;
                }
                if (uVar13 < 10000) goto LAB_0047fb81;
                uVar33 = uVar33 / 10000;
                uVar11 = __len + 4;
              } while (99999 < uVar13);
              __len = __len + 1;
            }
LAB_0047fb81:
            local_540 = local_530;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_540,(char)__len - (char)((int)uVar5 >> 0x1f));
            local_588._16_8_ = pLVar25;
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(uVar5 >> 0x1f) + (long)local_540),__len,__val);
            uVar33 = 0xf;
            if (local_520 != &local_510) {
              uVar33 = local_510;
            }
            if (uVar33 < (ulong)(local_538 + local_518)) {
              uVar33 = 0xf;
              if (local_540 != local_530) {
                uVar33 = local_530[0];
              }
              if (uVar33 < (ulong)(local_538 + local_518)) goto LAB_0047fc48;
              puVar22 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_540,0,(char *)0x0,(ulong)local_520);
            }
            else {
LAB_0047fc48:
              puVar22 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_520,(ulong)local_540);
            }
            plVar24 = puVar22 + 2;
            if ((long *)*puVar22 == plVar24) {
              local_4f0 = *plVar24;
              acStack_4e8 = (char  [8])puVar22[3];
              local_500 = &local_4f0;
            }
            else {
              local_4f0 = *plVar24;
              local_500 = (long *)*puVar22;
            }
            local_4f8 = (char  [8])puVar22[1];
            *puVar22 = plVar24;
            puVar22[1] = 0;
            *(undefined1 *)plVar24 = 0;
            plVar24 = (long *)std::__cxx11::string::append((char *)&local_500);
            plVar28 = plVar24 + 2;
            if ((long *)*plVar24 == plVar28) {
              local_490 = *plVar28;
              lStack_488 = plVar24[3];
              local_4a0 = &local_490;
            }
            else {
              local_490 = *plVar28;
              local_4a0 = (long *)*plVar24;
            }
            local_498 = plVar24[1];
            *plVar24 = (long)plVar28;
            plVar24[1] = 0;
            *(undefined1 *)(plVar24 + 2) = 0;
            plVar24 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_4a0,(ulong)local_4c0[0]);
            paVar14 = (aiNode *)(plVar24 + 2);
            if ((aiNode *)*plVar24 == paVar14) {
              local_588._0_4_ = (paVar14->mName).length;
              local_588[4] = (paVar14->mName).data[0];
              local_588[5] = (paVar14->mName).data[1];
              local_588[6] = (paVar14->mName).data[2];
              local_588[7] = (paVar14->mName).data[3];
              local_588._8_8_ = plVar24[3];
              local_598 = (aiNode *)local_588;
            }
            else {
              local_588._0_4_ = (paVar14->mName).length;
              local_588[4] = (paVar14->mName).data[0];
              local_588[5] = (paVar14->mName).data[1];
              local_588[6] = (paVar14->mName).data[2];
              local_588[7] = (paVar14->mName).data[3];
              local_598 = (aiNode *)*plVar24;
            }
            local_590 = plVar24[1];
            *plVar24 = (long)paVar14;
            plVar24[1] = 0;
            *(undefined1 *)(plVar24 + 2) = 0;
            plVar24 = (long *)std::__cxx11::string::append((char *)&local_598);
            local_5e8 = &local_5d8;
            puVar30 = (ulong *)(plVar24 + 2);
            if ((ulong *)*plVar24 == puVar30) {
              local_5d8 = *puVar30;
              lStack_5d0 = plVar24[3];
            }
            else {
              local_5d8 = *puVar30;
              local_5e8 = (ulong *)*plVar24;
            }
            local_5e0 = plVar24[1];
            *plVar24 = (long)puVar30;
            plVar24[1] = 0;
            *(undefined1 *)(plVar24 + 2) = 0;
            local_560 = local_550;
            std::__cxx11::string::_M_construct((ulong)&local_560,'\x04');
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_560,4,0x400);
            uVar33 = 0xf;
            if (local_5e8 != &local_5d8) {
              uVar33 = local_5d8;
            }
            if (uVar33 < local_558 + local_5e0) {
              uVar33 = 0xf;
              if (local_560 != local_550) {
                uVar33 = local_550[0];
              }
              if (uVar33 < local_558 + local_5e0) goto LAB_0047fe75;
              plVar24 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_560,0,(char *)0x0,(ulong)local_5e8);
            }
            else {
LAB_0047fe75:
              plVar24 = (long *)std::__cxx11::string::_M_append((char *)&local_5e8,(ulong)local_560)
              ;
            }
            local_618 = (aiNode *)local_608;
            paVar14 = (aiNode *)(plVar24 + 2);
            if ((aiNode *)*plVar24 == paVar14) {
              local_608._0_4_ = (paVar14->mName).length;
              local_608[4] = (paVar14->mName).data[0];
              local_608[5] = (paVar14->mName).data[1];
              local_608[6] = (paVar14->mName).data[2];
              local_608[7] = (paVar14->mName).data[3];
              local_608._8_8_ = plVar24[3];
            }
            else {
              local_608._0_4_ = (paVar14->mName).length;
              local_608[4] = (paVar14->mName).data[0];
              local_608[5] = (paVar14->mName).data[1];
              local_608[6] = (paVar14->mName).data[2];
              local_608[7] = (paVar14->mName).data[3];
              local_618 = (aiNode *)*plVar24;
            }
            local_610 = plVar24[1];
            *plVar24 = (long)paVar14;
            plVar24[1] = 0;
            *(undefined1 *)&(paVar14->mName).length = 0;
            plVar24 = (long *)std::__cxx11::string::append((char *)&local_618);
            psVar27 = (size_type *)(plVar24 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar24 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_438[0].field_2._0_8_ = *psVar27;
              local_438[0].field_2._8_8_ = plVar24[3];
              local_438[0]._M_dataplus._M_p = (pointer)paVar34;
            }
            else {
              local_438[0].field_2._0_8_ = *psVar27;
              local_438[0]._M_dataplus._M_p = (pointer)*plVar24;
            }
            local_438[0]._M_string_length = plVar24[1];
            *plVar24 = (long)psVar27;
            plVar24[1] = 0;
            *(undefined1 *)(plVar24 + 2) = 0;
            Logger::warn((Logger *)local_588._16_8_,local_438[0]._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438[0]._M_dataplus._M_p != paVar34) {
              operator_delete(local_438[0]._M_dataplus._M_p,
                              local_438[0].field_2._M_allocated_capacity + 1);
            }
            if (local_618 != (aiNode *)local_608) {
              operator_delete(local_618,local_608._0_8_ + 1);
            }
            if (local_560 != local_550) {
              operator_delete(local_560,local_550[0] + 1);
            }
            if (local_5e8 != &local_5d8) {
              operator_delete(local_5e8,local_5d8 + 1);
            }
            if (local_598 != (aiNode *)local_588) {
              operator_delete(local_598,local_588._0_8_ + 1);
            }
            if (local_4a0 != &local_490) {
              operator_delete(local_4a0,local_490 + 1);
            }
            if (local_500 != &local_4f0) {
              operator_delete(local_500,local_4f0 + 1);
            }
            if (local_540 != local_530) {
              operator_delete(local_540,local_530[0] + 1);
            }
            if (local_520 != &local_510) {
              operator_delete(local_520,local_510 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_478._M_dataplus._M_p != &local_478.field_2) {
              operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_4c0[0] != local_4b0) {
              operator_delete(local_4c0[0],local_4b0[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
              operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_458[0] != local_448) {
              operator_delete(local_458[0],local_448[0] + 1);
            }
          }
          pcVar31 = ((*(Header_HL1 **)(local_608._16_8_ + 0x28))->super_HalfLifeMDLBaseHeader).ident
                    + *(int *)(local_628 + 0x34);
          paVar14 = (aiNode *)operator_new(0x478);
          local_438[0]._M_dataplus._M_p = (pointer)paVar34;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"AnimationEvents","");
          aiNode::aiNode(paVar14,local_438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p != paVar34) {
            operator_delete(local_438[0]._M_dataplus._M_p,
                            local_438[0].field_2._M_allocated_capacity + 1);
          }
          local_598 = paVar14;
          if (iStack_5c0._M_current == local_5b8) {
            std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                      ((vector<aiNode*,std::allocator<aiNode*>> *)&local_5c8,iStack_5c0,&local_598);
          }
          else {
            *iStack_5c0._M_current = paVar14;
            iStack_5c0._M_current = iStack_5c0._M_current + 1;
          }
          paVar14 = local_598;
          local_598->mParent = local_5a8;
          uVar5 = *(uint *)(local_628 + 0x30);
          local_598->mNumChildren = uVar5;
          ppaVar15 = (aiNode **)operator_new__((ulong)uVar5 << 3);
          paVar14->mChildren = ppaVar15;
          if (paVar14->mNumChildren != 0) {
            uVar33 = 0;
            do {
              paVar14 = (aiNode *)operator_new(0x478);
              aiNode::aiNode(paVar14);
              local_598->mChildren[uVar33] = paVar14;
              paVar14->mParent = local_598;
              paVar16 = (aiMetadata *)operator_new(0x18);
              paVar16->mNumProperties = 3;
              paVar17 = (aiString *)operator_new__(0xc0c);
              lVar32 = 5;
              do {
                pcVar2 = paVar17->data + lVar32 + -9;
                pcVar2[0] = '\0';
                pcVar2[1] = '\0';
                pcVar2[2] = '\0';
                pcVar2[3] = '\0';
                paVar17->data[lVar32 + -5] = '\0';
                memset(paVar17->data + lVar32 + -4,0x1b,0x3ff);
                lVar32 = lVar32 + 0x404;
              } while (lVar32 != 0xc11);
              paVar16->mKeys = paVar17;
              paVar18 = (aiMetadataEntry *)operator_new__(0x30);
              *(undefined8 *)(paVar18 + 2) = 0;
              paVar18[2].mData = (void *)0x0;
              *(undefined8 *)(paVar18 + 1) = 0;
              paVar18[1].mData = (void *)0x0;
              *(undefined8 *)paVar18 = 0;
              paVar18->mData = (void *)0x0;
              paVar16->mValues = paVar18;
              paVar14->mMetaData = paVar16;
              local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Frame","");
              sVar10 = local_438[0]._M_string_length;
              if ((paVar16->mNumProperties != 0) && (local_438[0]._M_string_length != 0)) {
                if (local_438[0]._M_string_length < 0x400) {
                  paVar17 = paVar16->mKeys;
                  paVar17->length = (ai_uint32)local_438[0]._M_string_length;
                  memcpy(paVar17->data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length);
                  paVar17->data[sVar10] = '\0';
                }
                paVar16->mValues->mType = AI_INT32;
                puVar20 = (undefined4 *)operator_new(4);
                *puVar20 = *(undefined4 *)pcVar31;
                paVar16->mValues->mData = puVar20;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
                operator_delete(local_438[0]._M_dataplus._M_p,
                                local_438[0].field_2._M_allocated_capacity + 1);
              }
              local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"ScriptEvent","");
              sVar10 = local_438[0]._M_string_length;
              if ((1 < paVar16->mNumProperties) && (local_438[0]._M_string_length != 0)) {
                if (local_438[0]._M_string_length < 0x400) {
                  paVar17 = paVar16->mKeys;
                  paVar17[1].length = (ai_uint32)local_438[0]._M_string_length;
                  memcpy(paVar17[1].data,local_438[0]._M_dataplus._M_p,local_438[0]._M_string_length
                        );
                  paVar17[1].data[sVar10] = '\0';
                }
                paVar16->mValues[1].mType = AI_INT32;
                piVar26 = (int32_t *)operator_new(4);
                *piVar26 = *(int32_t *)(pcVar31 + 4);
                paVar16->mValues[1].mData = piVar26;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
                operator_delete(local_438[0]._M_dataplus._M_p,
                                local_438[0].field_2._M_allocated_capacity + 1);
              }
              local_618 = (aiNode *)local_608;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"Options","");
              local_5e8 = &local_5d8;
              sVar29 = strlen(pcVar31 + 0xc);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_5e8,pcVar31 + 0xc,pcVar31 + sVar29 + 0xc);
              puVar30 = local_5e8;
              sVar29 = local_5e0 & 0xffffffff;
              if ((local_5e0 & 0xfffffc00) != 0) {
                sVar29 = 0x3ff;
              }
              local_438[0]._M_dataplus._M_p._0_4_ = (uint)sVar29;
              memcpy((void *)((long)&local_438[0]._M_dataplus._M_p + 4),local_5e8,sVar29);
              uVar8 = local_610;
              *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + sVar29 + 4) = 0;
              if ((2 < paVar16->mNumProperties) && (local_610 != 0)) {
                if (local_610 < 0x400) {
                  paVar17 = paVar16->mKeys;
                  paVar17[2].length = (ai_uint32)local_610;
                  memcpy(paVar17[2].data,local_618,local_610);
                  paVar17[2].data[uVar8] = '\0';
                }
                paVar16->mValues[2].mType = AI_AISTRING;
                puVar20 = (undefined4 *)operator_new(0x404);
                if (0x3fe < (uint)sVar29) {
                  sVar29 = 0x3ff;
                }
                *puVar20 = (int)sVar29;
                memcpy(puVar20 + 1,(void *)((long)&local_438[0]._M_dataplus._M_p + 4),sVar29);
                *(undefined1 *)((long)puVar20 + sVar29 + 4) = 0;
                paVar16->mValues[2].mData = puVar20;
                puVar30 = local_5e8;
              }
              if (puVar30 != &local_5d8) {
                operator_delete(puVar30,local_5d8 + 1);
              }
              if (local_618 != (aiNode *)local_608) {
                operator_delete(local_618,local_608._0_8_ + 1);
              }
              uVar33 = uVar33 + 1;
              pcVar31 = pcVar31 + 0x4c;
            } while (uVar33 < local_598->mNumChildren);
          }
        }
        if ((long)iStack_5c0._M_current - (long)local_5c8 != 0) {
          aiNode::addChildren(local_5a8,
                              (uint)((ulong)((long)iStack_5c0._M_current - (long)local_5c8) >> 3),
                              local_5c8);
        }
        lVar32 = local_480 + 1;
        local_628 = local_628 + 0xb0;
      } while (lVar32 < (*(Header_HL1 **)(local_608._16_8_ + 0x28))->numseq);
      if (local_5c8 != (aiNode **)0x0) {
        operator_delete(local_5c8,(long)local_5b8 - (long)local_5c8);
      }
    }
  }
  return;
}

Assistant:

void HL1MDLLoader::read_sequence_infos() {
    if (!header_->numseq)
        return;

    const SequenceDesc_HL1 *pseqdesc = (const SequenceDesc_HL1 *)((uint8_t *)header_ + header_->seqindex);

    aiNode *sequence_infos_node = new aiNode(AI_MDL_HL1_NODE_SEQUENCE_INFOS);
    rootnode_children_.push_back(sequence_infos_node);

    sequence_infos_node->mNumChildren = static_cast<unsigned int>(header_->numseq);
    sequence_infos_node->mChildren = new aiNode *[sequence_infos_node->mNumChildren];

    std::vector<aiNode *> sequence_info_node_children;

    int animation_index = 0;
    for (int i = 0; i < header_->numseq; ++i, ++pseqdesc) {
        // Clear the list of children for the upcoming sequence info node.
        sequence_info_node_children.clear();

        aiNode *sequence_info_node = sequence_infos_node->mChildren[i] = new aiNode(unique_sequence_names_[i]);
        sequence_info_node->mParent = sequence_infos_node;

        // Setup sequence info node Metadata.
        aiMetadata *md = sequence_info_node->mMetaData = aiMetadata::Alloc(16);
        md->Set(0, "AnimationIndex", animation_index);
        animation_index += pseqdesc->numblends;

        // Reference the sequence group by name. This allows us to search a particular
        // sequence group by name using aiNode(s).
        md->Set(1, "SequenceGroup", aiString(unique_sequence_groups_names_[pseqdesc->seqgroup]));
        md->Set(2, "FramesPerSecond", pseqdesc->fps);
        md->Set(3, "NumFrames", pseqdesc->numframes);
        md->Set(4, "NumBlends", pseqdesc->numblends);
        md->Set(5, "Activity", pseqdesc->activity);
        md->Set(6, "ActivityWeight", pseqdesc->actweight);
        md->Set(7, "MotionFlags", pseqdesc->motiontype);
        md->Set(8, "MotionBone", temp_bones_[pseqdesc->motionbone].node->mName);
        md->Set(9, "LinearMovement", aiVector3D(pseqdesc->linearmovement[0], pseqdesc->linearmovement[1], pseqdesc->linearmovement[2]));
        md->Set(10, "BBMin", aiVector3D(pseqdesc->bbmin[0], pseqdesc->bbmin[1], pseqdesc->bbmin[2]));
        md->Set(11, "BBMax", aiVector3D(pseqdesc->bbmax[0], pseqdesc->bbmax[1], pseqdesc->bbmax[2]));
        md->Set(12, "EntryNode", pseqdesc->entrynode);
        md->Set(13, "ExitNode", pseqdesc->exitnode);
        md->Set(14, "NodeFlags", pseqdesc->nodeflags);
        md->Set(15, "Flags", pseqdesc->flags);

        if (import_settings_.read_blend_controllers) {
            int num_blend_controllers;
            if (get_num_blend_controllers(pseqdesc->numblends, num_blend_controllers) && num_blend_controllers) {
                // Read blend controllers info.
                aiNode *blend_controllers_node = new aiNode(AI_MDL_HL1_NODE_BLEND_CONTROLLERS);
                sequence_info_node_children.push_back(blend_controllers_node);
                blend_controllers_node->mParent = sequence_info_node;
                blend_controllers_node->mNumChildren = static_cast<unsigned int>(num_blend_controllers);
                blend_controllers_node->mChildren = new aiNode *[blend_controllers_node->mNumChildren];

                for (unsigned int j = 0; j < blend_controllers_node->mNumChildren; ++j) {
                    aiNode *blend_controller_node = blend_controllers_node->mChildren[j] = new aiNode();
                    blend_controller_node->mParent = blend_controllers_node;

                    aiMetadata *md = blend_controller_node->mMetaData = aiMetadata::Alloc(3);
                    md->Set(0, "Start", pseqdesc->blendstart[j]);
                    md->Set(1, "End", pseqdesc->blendend[j]);
                    md->Set(2, "MotionFlags", pseqdesc->blendtype[j]);
                }
            }
        }

        if (import_settings_.read_animation_events && pseqdesc->numevents) {
            // Read animation events.

            if (pseqdesc->numevents > AI_MDL_HL1_MAX_EVENTS) {
                log_warning_limit_exceeded<AI_MDL_HL1_MAX_EVENTS>(
                        "Sequence " + std::string(pseqdesc->label),
                        pseqdesc->numevents, "animation events");
            }

            const AnimEvent_HL1 *pevent = (const AnimEvent_HL1 *)((uint8_t *)header_ + pseqdesc->eventindex);

            aiNode *pEventsNode = new aiNode(AI_MDL_HL1_NODE_ANIMATION_EVENTS);
            sequence_info_node_children.push_back(pEventsNode);
            pEventsNode->mParent = sequence_info_node;
            pEventsNode->mNumChildren = static_cast<unsigned int>(pseqdesc->numevents);
            pEventsNode->mChildren = new aiNode *[pEventsNode->mNumChildren];

            for (unsigned int j = 0; j < pEventsNode->mNumChildren; ++j, ++pevent) {
                aiNode *pEvent = pEventsNode->mChildren[j] = new aiNode();
                pEvent->mParent = pEventsNode;

                aiMetadata *md = pEvent->mMetaData = aiMetadata::Alloc(3);
                md->Set(0, "Frame", pevent->frame);
                md->Set(1, "ScriptEvent", pevent->event);
                md->Set(2, "Options", aiString(pevent->options));
            }
        }

        if (sequence_info_node_children.size()) {
            sequence_info_node->addChildren(
                    static_cast<unsigned int>(sequence_info_node_children.size()),
                    sequence_info_node_children.data());
        }
    }
}